

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binder.cpp
# Opt level: O3

void duckdb::VerifyNotExcluded(ParsedExpression *expr)

{
  bool bVar1;
  int iVar2;
  ColumnRefExpression *this;
  string *psVar3;
  NotImplementedException *this_00;
  _Any_data local_48;
  code *local_38;
  code *local_30;
  
  if ((expr->super_BaseExpression).type == COLUMN_REF) {
    this = BaseExpression::Cast<duckdb::ColumnRefExpression>(&expr->super_BaseExpression);
    bVar1 = ColumnRefExpression::IsQualified(this);
    if (bVar1) {
      psVar3 = ColumnRefExpression::GetTableName_abi_cxx11_(this);
      iVar2 = ::std::__cxx11::string::compare((char *)psVar3);
      if (iVar2 == 0) {
        this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
        local_48._M_unused._M_object = &local_38;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_48,
                   "\'excluded\' qualified columns are not supported in the RETURNING clause yet",""
                  );
        NotImplementedException::NotImplementedException(this_00,(string *)&local_48);
        __cxa_throw(this_00,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error)
        ;
      }
    }
  }
  else {
    local_48._M_unused._M_object = (void *)0x0;
    local_48._8_8_ = 0;
    local_30 = ::std::
               _Function_handler<void_(duckdb::ParsedExpression_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/planner/binder.cpp:675:12)>
               ::_M_invoke;
    local_38 = ::std::
               _Function_handler<void_(duckdb::ParsedExpression_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/planner/binder.cpp:675:12)>
               ::_M_manager;
    ParsedExpressionIterator::EnumerateChildren
              (expr,(function<void_(duckdb::ParsedExpression_&)> *)&local_48);
    if (local_38 != (code *)0x0) {
      (*local_38)(&local_48,&local_48,3);
    }
  }
  return;
}

Assistant:

void VerifyNotExcluded(ParsedExpression &expr) {
	if (expr.GetExpressionType() == ExpressionType::COLUMN_REF) {
		auto &column_ref = expr.Cast<ColumnRefExpression>();
		if (!column_ref.IsQualified()) {
			return;
		}
		auto &table_name = column_ref.GetTableName();
		if (table_name == "excluded") {
			throw NotImplementedException("'excluded' qualified columns are not supported in the RETURNING clause yet");
		}
		return;
	}
	ParsedExpressionIterator::EnumerateChildren(
	    expr, [&](const ParsedExpression &child) { VerifyNotExcluded((ParsedExpression &)child); });
}